

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_extension.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::ExtensionGenerator::ExtensionGenerator
          (ExtensionGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  string *psVar1;
  CppType CVar2;
  EnumDescriptor *pEVar3;
  Descriptor *this_00;
  undefined1 in_CL;
  FieldDescriptor *this_01;
  string sStack_38;
  
  this->descriptor_ = descriptor;
  (this->type_traits_)._M_dataplus._M_p = (pointer)&(this->type_traits_).field_2;
  (this->type_traits_)._M_string_length = 0;
  psVar1 = &this->type_traits_;
  (this->type_traits_).field_2._M_local_buf[0] = '\0';
  Options::Options(&this->options_,options);
  this_01 = this->descriptor_;
  if (*(int *)(this_01 + 0x4c) == 3) {
    std::__cxx11::string::assign((char *)psVar1);
    this_01 = this->descriptor_;
  }
  CVar2 = FieldDescriptor::cpp_type(this_01);
  if (CVar2 == CPPTYPE_MESSAGE) {
    std::__cxx11::string::append((char *)psVar1);
    this_00 = FieldDescriptor::message_type(this->descriptor_);
    ClassName_abi_cxx11_(&sStack_38,(cpp *)this_00,(Descriptor *)0x1,(bool)in_CL);
    std::__cxx11::string::append((string *)psVar1);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  else if (CVar2 != CPPTYPE_STRING) {
    if (CVar2 == CPPTYPE_ENUM) {
      std::__cxx11::string::append((char *)psVar1);
      pEVar3 = FieldDescriptor::enum_type(this->descriptor_);
      ClassName_abi_cxx11_(&sStack_38,(cpp *)pEVar3,(EnumDescriptor *)0x1,(bool)in_CL);
      std::__cxx11::string::append((string *)psVar1);
      std::__cxx11::string::~string((string *)&sStack_38);
      std::__cxx11::string::append((char *)psVar1);
      pEVar3 = FieldDescriptor::enum_type(this->descriptor_);
      ClassName_abi_cxx11_(&sStack_38,(cpp *)pEVar3,(EnumDescriptor *)0x1,(bool)in_CL);
      std::__cxx11::string::append((string *)psVar1);
      std::__cxx11::string::~string((string *)&sStack_38);
    }
    else {
      std::__cxx11::string::append((char *)psVar1);
      CVar2 = FieldDescriptor::cpp_type(this->descriptor_);
      PrimitiveTypeName(CVar2);
      std::__cxx11::string::append((char *)psVar1);
    }
  }
  std::__cxx11::string::append((char *)psVar1);
  return;
}

Assistant:

ExtensionGenerator::ExtensionGenerator(const FieldDescriptor* descriptor,
                                       const Options& options)
  : descriptor_(descriptor),
    options_(options) {
  // Construct type_traits_.
  if (descriptor_->is_repeated()) {
    type_traits_ = "Repeated";
  }

  switch (descriptor_->cpp_type()) {
    case FieldDescriptor::CPPTYPE_ENUM:
      type_traits_.append("EnumTypeTraits< ");
      type_traits_.append(ClassName(descriptor_->enum_type(), true));
      type_traits_.append(", ");
      type_traits_.append(ClassName(descriptor_->enum_type(), true));
      type_traits_.append("_IsValid>");
      break;
    case FieldDescriptor::CPPTYPE_STRING:
      type_traits_.append("StringTypeTraits");
      break;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      type_traits_.append("MessageTypeTraits< ");
      type_traits_.append(ClassName(descriptor_->message_type(), true));
      type_traits_.append(" >");
      break;
    default:
      type_traits_.append("PrimitiveTypeTraits< ");
      type_traits_.append(PrimitiveTypeName(descriptor_->cpp_type()));
      type_traits_.append(" >");
      break;
  }
}